

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O2

void __thiscall JsonNumber_One_Test::TestBody(JsonNumber_One_Test *this)

{
  TypedExpectation<std::error_code_(unsigned_long)> *this_00;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_01;
  char *in_R9;
  AssertHelper AStack_f8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  AssertionResult gtest_ar_;
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_e8,1);
  mock_json_callbacks::gmock_uint64_value
            ((MockSpec<std::error_code_(unsigned_long)> *)&p,
             &(this->super_JsonNumber).callbacks_.super_mock_json_callbacks,
             (Matcher<unsigned_long> *)&local_e8);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<std::error_code_(unsigned_long)>::InternalExpectedAt
                      ((MockSpec<std::error_code_(unsigned_long)> *)&p,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_number.cpp"
                       ,0x39,"callbacks_","uint64_value (1)");
  testing::internal::TypedExpectation<std::error_code_(unsigned_long)>::Times(this_00,1);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&p.stack_);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_e8);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::parser
            (&p,(this->super_JsonNumber).proxy_.original_,none);
  s_abi_cxx11_(&local_e8," 1 ",3);
  this_01 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input(&p,&local_e8);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_01);
  std::__cxx11::string::~string((string *)&local_e8);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = p.error_._M_value == 0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e8,(internal *)&gtest_ar_,(AssertionResult *)"p.has_error ()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_number.cpp"
               ,0x3c,local_e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_f8);
    std::__cxx11::string::~string((string *)&local_e8);
    if (local_f0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f0._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::~parser(&p);
  return;
}

Assistant:

TEST_F (JsonNumber, One) {
    EXPECT_CALL (callbacks_, uint64_value (1)).Times (1);
    json::parser<decltype (proxy_)> p (proxy_);
    p.input (" 1 "s).eof ();
    EXPECT_FALSE (p.has_error ());
}